

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O0

int cmdline_parser_config_file
              (char *filename,gengetopt_args_info *args_info,cmdline_parser_params *params)

{
  char *pcVar1;
  void *__ptr;
  size_t sVar2;
  char *in_RDI;
  char *additional_error;
  char **my_argv_arg;
  int my_argc;
  int result;
  int i;
  char *in_stack_000001a8;
  cmdline_parser_params *in_stack_000001b0;
  gengetopt_args_info *in_stack_000001b8;
  char **in_stack_000001c0;
  int in_stack_000001c8;
  int *in_stack_00001010;
  char *in_stack_00001018;
  char *in_stack_ffffffffffffffc8;
  int local_20;
  int local_1c;
  
  cmd_line_list_tmp = (line_list *)malloc(0x10);
  cmd_line_list_tmp->next = cmd_line_list;
  cmd_line_list = cmd_line_list_tmp;
  pcVar1 = gengetopt_strdup(in_stack_ffffffffffffffc8);
  cmd_line_list->string_arg = pcVar1;
  local_20 = _cmdline_parser_configfile(in_stack_00001018,in_stack_00001010);
  if (local_20 != 1) {
    __ptr = malloc(0x10);
    cmd_line_list_tmp = cmd_line_list;
    for (local_1c = 0; -1 < local_1c; local_1c = local_1c + -1) {
      *(char **)((long)__ptr + (long)local_1c * 8) = cmd_line_list_tmp->string_arg;
      cmd_line_list_tmp = cmd_line_list_tmp->next;
    }
    *(undefined8 *)((long)__ptr + 8) = 0;
    sVar2 = strlen(in_RDI);
    pcVar1 = (char *)malloc(sVar2 + 0x18);
    strcpy(pcVar1," in configuration file ");
    strcat(pcVar1,in_RDI);
    local_20 = cmdline_parser_internal
                         (in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,in_stack_000001b0,
                          in_stack_000001a8);
    free(pcVar1);
    free(__ptr);
  }
  free_cmd_list();
  return local_20;
}

Assistant:

int
cmdline_parser_config_file (const char *filename,
                           struct gengetopt_args_info *args_info,
                           struct cmdline_parser_params *params)
{
  int i, result;
  int my_argc = 1;
  char **my_argv_arg;
  char *additional_error;

  /* store the program name */
  cmd_line_list_tmp = (struct line_list *) malloc (sizeof (struct line_list));
  cmd_line_list_tmp->next = cmd_line_list;
  cmd_line_list = cmd_line_list_tmp;
  cmd_line_list->string_arg = gengetopt_strdup (CMDLINE_PARSER_PACKAGE);

  result = _cmdline_parser_configfile(filename, &my_argc);

  if (result != EXIT_FAILURE) {
    my_argv_arg = (char **) malloc((my_argc+1) * sizeof(char *));
    cmd_line_list_tmp = cmd_line_list;

    for (i = my_argc - 1; i >= 0; --i) {
      my_argv_arg[i] = cmd_line_list_tmp->string_arg;
      cmd_line_list_tmp = cmd_line_list_tmp->next;
    }

    my_argv_arg[my_argc] = 0;

    additional_error = (char *)malloc(strlen(filename) + strlen(ADDITIONAL_ERROR) + 1);
    strcpy (additional_error, ADDITIONAL_ERROR);
    strcat (additional_error, filename);
    result =
      cmdline_parser_internal (my_argc, my_argv_arg, args_info,
                              params,
                              additional_error);

    free (additional_error);
    free (my_argv_arg);
  }

  free_cmd_list();
  return result;
}